

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderEvalContext::ShaderEvalContext(ShaderEvalContext *this,QuadGrid *quadGrid_)

{
  int *piVar1;
  pointer pTVar2;
  uint uVar3;
  int ndx;
  long lVar4;
  long lVar5;
  Sampler *this_00;
  
  tcu::Vector<float,_4>::Vector(&this->coords);
  tcu::Vector<float,_4>::Vector(&this->unitCoords);
  tcu::Vector<float,_4>::Vector(&this->constCoords,&quadGrid_->m_constCoords);
  lVar4 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)this->in[0].m_data + lVar4));
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x40);
  lVar4 = 0x70;
  do {
    ShaderSampler::ShaderSampler((ShaderSampler *)((long)(this->coords).m_data + lVar4));
    lVar4 = lVar4 + 0x60;
  } while (lVar4 != 0x1f0);
  this_00 = &this->textures[0].sampler;
  tcu::Vector<float,_4>::Vector(&this->color);
  this->isDiscarded = false;
  this->quadGrid = quadGrid_;
  lVar5 = 0;
  lVar4 = 0;
  while( true ) {
    pTVar2 = (quadGrid_->m_textures).
             super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(quadGrid_->m_textures).
                     super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x48) <= lVar4)
    break;
    if (*(int *)((long)&pTVar2->m_type + lVar5) != 0) {
      piVar1 = (int *)((long)&pTVar2->m_type + lVar5);
      tcu::Sampler::operator=(this_00,(Sampler *)(piVar1 + 1));
      uVar3 = *piVar1 - 1;
      if (uVar3 < 4) {
        *(long *)(&this_00[1].wrapT + (ulong)uVar3 * 2) =
             *(long *)((long)&pTVar2->m_binding + lVar5) +
             *(long *)(&DAT_017d8a38 + (ulong)uVar3 * 8);
      }
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x48;
    this_00 = (Sampler *)&this_00[1].borderColor;
  }
  return;
}

Assistant:

ShaderEvalContext::ShaderEvalContext (const QuadGrid& quadGrid_)
	: constCoords	(quadGrid_.getConstCoords())
	, isDiscarded	(false)
	, quadGrid		(quadGrid_)
{
	const vector<TextureBinding>& bindings = quadGrid.getTextures();
	DE_ASSERT((int)bindings.size() <= MAX_TEXTURES);

	// Fill in texture array.
	for (int ndx = 0; ndx < (int)bindings.size(); ndx++)
	{
		const TextureBinding& binding = bindings[ndx];

		if (binding.getType() == TextureBinding::TYPE_NONE)
			continue;

		textures[ndx].sampler = binding.getSampler();

		switch (binding.getType())
		{
			case TextureBinding::TYPE_2D:		textures[ndx].tex2D			= &binding.get2D()->getRefTexture();		break;
			case TextureBinding::TYPE_CUBE_MAP:	textures[ndx].texCube		= &binding.getCube()->getRefTexture();		break;
			case TextureBinding::TYPE_2D_ARRAY:	textures[ndx].tex2DArray	= &binding.get2DArray()->getRefTexture();	break;
			case TextureBinding::TYPE_3D:		textures[ndx].tex3D			= &binding.get3D()->getRefTexture();		break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}